

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall DQuickSaveMenu::DQuickSaveMenu(DQuickSaveMenu *this,bool playsound)

{
  char *fmt;
  FString tempstring;
  FString local_28;
  FName local_1c;
  
  local_1c.Index = 0;
  DMessageBoxMenu::DMessageBoxMenu
            (&this->super_DMessageBoxMenu,(DMenu *)0x0,(char *)0x0,0,false,&local_1c);
  (this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006e8948;
  local_28.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  fmt = FStringTable::operator()(&GStrings,"QSPROMPT");
  FString::Format(&local_28,fmt,quickSaveSlot);
  DMessageBoxMenu::Init(&this->super_DMessageBoxMenu,(DMenu *)0x0,local_28.Chars,0,playsound);
  FString::~FString(&local_28);
  return;
}

Assistant:

DQuickSaveMenu::DQuickSaveMenu(bool playsound)
{
	FString tempstring;

	tempstring.Format(GStrings("QSPROMPT"), quickSaveSlot->Title);
	Init(NULL, tempstring, 0, playsound);
}